

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFileBuffer.cpp
# Opt level: O0

bool TEST_getChar(void)

{
  bool bVar1;
  char cVar2;
  void *pvVar3;
  void *pvVar4;
  char *file;
  ifstream *this;
  int local_f4;
  int i_1;
  ifstream *bufferExtern;
  undefined1 local_e0 [4];
  int count;
  FileBuffer bufferIntern;
  int i;
  char *bufferOutputExtern;
  char *bufferOutputIntern;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [8];
  string sampleFilePath;
  bool local_9;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ALESysProg[P]sysprog/build_O0/src"
             ,&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_88,"/Testfiles/sample1.txt",(allocator *)((long)&bufferOutputIntern + 7));
  std::operator+(local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_50);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)((long)&bufferOutputIntern + 7));
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pvVar3 = operator_new__(10000);
  pvVar4 = operator_new__(10000);
  for (bufferIntern._52_4_ = 0; (int)bufferIntern._52_4_ < 10000;
      bufferIntern._52_4_ = bufferIntern._52_4_ + 1) {
    *(undefined1 *)((long)pvVar4 + (long)(int)bufferIntern._52_4_) = 0;
    *(undefined1 *)((long)pvVar3 + (long)(int)bufferIntern._52_4_) = 0;
  }
  file = (char *)std::__cxx11::string::data();
  FileBuffer::FileBuffer((FileBuffer *)local_e0,file,500,2);
  for (bufferExtern._4_4_ = 0; bVar1 = FileBuffer::isEnd((FileBuffer *)local_e0),
      !bVar1 && bufferExtern._4_4_ < 10000; bufferExtern._4_4_ = bufferExtern._4_4_ + 1) {
    cVar2 = FileBuffer::getChar((FileBuffer *)local_e0);
    *(char *)((long)pvVar3 + (long)bufferExtern._4_4_) = cVar2;
  }
  this = (ifstream *)operator_new(0x208);
  std::ifstream::ifstream(this);
  std::ifstream::open(this,local_30,8);
  std::istream::read((char *)this,(long)pvVar4);
  std::ifstream::close();
  local_f4 = 0;
  do {
    if (9999 < local_f4) {
      local_9 = true;
LAB_0010260d:
      FileBuffer::~FileBuffer((FileBuffer *)local_e0);
      std::__cxx11::string::~string((string *)local_30);
      return local_9;
    }
    if (*(char *)((long)pvVar3 + (long)local_f4) != *(char *)((long)pvVar4 + (long)local_f4)) {
      local_9 = false;
      goto LAB_0010260d;
    }
    local_f4 = local_f4 + 1;
  } while( true );
}

Assistant:

bool TEST_getChar() {
    // Define sample file
    string sampleFilePath = string(Compiler_PROJECT_BINARY_DIR) + string("/Testfiles/sample1.txt");

    // Create 2 buffers and empty them
    char *bufferOutputIntern = new char[10000];
    char *bufferOutputExtern = new char[10000];
    for (int i = 0; i < 10000; i++) {
        bufferOutputExtern[i] = '\0';
        bufferOutputIntern[i] = '\0';
    }

    // Load Buffer Intern
    FileBuffer bufferIntern = FileBuffer((char *) sampleFilePath.data());
    for (int count = 0; !bufferIntern.isEnd() && count < 10000; count++) {
        bufferOutputIntern[count] = bufferIntern.getChar();
    }

    // Load Buffer Extern
    ifstream* bufferExtern = new ifstream();
    bufferExtern->open(sampleFilePath);
    bufferExtern->read(bufferOutputExtern, 10000);
    bufferExtern->close();

    // Compare both buffers
    for (int i = 0; i < 10000; i++) {
        if (bufferOutputIntern[i] != bufferOutputExtern[i]) {
            return false;
        }
    }
    return true;
}